

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

OPJ_UINT32 opj_bio_read(opj_bio_t *bio,OPJ_UINT32 n)

{
  OPJ_UINT32 OVar1;
  uint uVar2;
  
  if (n != 0) {
    uVar2 = 0;
    while (0 < (int)n) {
      OVar1 = bio->ct;
      if (OVar1 == 0) {
        opj_bio_bytein(bio);
        OVar1 = bio->ct;
      }
      n = n - 1;
      bio->ct = OVar1 - 1;
      uVar2 = uVar2 | (uint)((bio->buf >> (OVar1 - 1 & 0x1f) & 1) != 0) << ((byte)n & 0x1f);
    }
    return uVar2;
  }
  __assert_fail("(n > 0U)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/bio.c"
                ,0xae,"OPJ_UINT32 opj_bio_read(opj_bio_t *, OPJ_UINT32)");
}

Assistant:

OPJ_UINT32 opj_bio_read(opj_bio_t *bio, OPJ_UINT32 n)
{
    OPJ_INT32 i;
    OPJ_UINT32 v;

    assert((n > 0U) /* && (n <= 32U)*/);
#ifdef OPJ_UBSAN_BUILD
    /* This assert fails for some corrupted images which are gracefully rejected */
    /* Add this assert only for ubsan build. */
    /* This is the condition for overflow not to occur below which is needed because of OPJ_NOSANITIZE */
    assert(n <= 32U);
#endif
    v = 0U;
    for (i = (OPJ_INT32)n - 1; i >= 0; i--) {
        v |= opj_bio_getbit(bio) <<
             i; /* can't overflow, opj_bio_getbit returns 0 or 1 */
    }
    return v;
}